

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code.cpp
# Opt level: O1

void opengv::absolute_pose::modules::gpnp3::compute
               (Matrix<double,_15,_18,_0,_15,_18> *groebnerMatrix)

{
  sPolynomial4(groebnerMatrix);
  sPolynomial5(groebnerMatrix);
  groebnerRow4_000_f(groebnerMatrix,5);
  sPolynomial6(groebnerMatrix);
  groebnerRow4_000_f(groebnerMatrix,6);
  groebnerRow5_000_f(groebnerMatrix,6);
  sPolynomial7(groebnerMatrix);
  groebnerRow5_100_f(groebnerMatrix,7);
  groebnerRow6_100_f(groebnerMatrix,7);
  groebnerRow4_000_f(groebnerMatrix,7);
  groebnerRow5_000_f(groebnerMatrix,7);
  groebnerRow6_000_f(groebnerMatrix,7);
  sPolynomial8(groebnerMatrix);
  groebnerRow4_100_f(groebnerMatrix,8);
  groebnerRow5_100_f(groebnerMatrix,8);
  groebnerRow6_100_f(groebnerMatrix,8);
  groebnerRow7_000_f(groebnerMatrix,8);
  groebnerRow3_000_f(groebnerMatrix,8);
  groebnerRow4_000_f(groebnerMatrix,8);
  groebnerRow5_000_f(groebnerMatrix,8);
  groebnerRow6_000_f(groebnerMatrix,8);
  sPolynomial9(groebnerMatrix);
  groebnerRow5_010_f(groebnerMatrix,9);
  groebnerRow3_100_f(groebnerMatrix,9);
  groebnerRow4_100_f(groebnerMatrix,9);
  groebnerRow5_100_f(groebnerMatrix,9);
  groebnerRow6_100_f(groebnerMatrix,9);
  groebnerRow7_000_f(groebnerMatrix,9);
  groebnerRow8_000_f(groebnerMatrix,9);
  groebnerRow3_000_f(groebnerMatrix,9);
  groebnerRow4_000_f(groebnerMatrix,9);
  groebnerRow5_000_f(groebnerMatrix,9);
  groebnerRow6_000_f(groebnerMatrix,9);
  sPolynomial10(groebnerMatrix);
  groebnerRow4_010_f(groebnerMatrix,10);
  groebnerRow5_010_f(groebnerMatrix,10);
  groebnerRow3_100_f(groebnerMatrix,10);
  groebnerRow4_100_f(groebnerMatrix,10);
  groebnerRow5_100_f(groebnerMatrix,10);
  groebnerRow6_100_f(groebnerMatrix,10);
  groebnerRow9_100_f(groebnerMatrix,10);
  groebnerRow8_000_f(groebnerMatrix,10);
  groebnerRow3_000_f(groebnerMatrix,10);
  groebnerRow4_000_f(groebnerMatrix,10);
  groebnerRow5_000_f(groebnerMatrix,10);
  groebnerRow6_000_f(groebnerMatrix,10);
  groebnerRow9_000_f(groebnerMatrix,10);
  sPolynomial11(groebnerMatrix);
  groebnerRow6_000_f(groebnerMatrix,0xb);
  groebnerRow9_000_f(groebnerMatrix,0xb);
  groebnerRow10_000_f(groebnerMatrix,0xb);
  sPolynomial12(groebnerMatrix);
  groebnerRow10_100_f(groebnerMatrix,0xc);
  groebnerRow11_100_f(groebnerMatrix,0xc);
  groebnerRow9_000_f(groebnerMatrix,0xc);
  groebnerRow10_000_f(groebnerMatrix,0xc);
  groebnerRow11_000_f(groebnerMatrix,0xc);
  sPolynomial13(groebnerMatrix);
  groebnerRow10_100_f(groebnerMatrix,0xd);
  groebnerRow11_010_f(groebnerMatrix,0xd);
  groebnerRow12_010_f(groebnerMatrix,0xd);
  groebnerRow11_100_f(groebnerMatrix,0xd);
  groebnerRow12_100_f(groebnerMatrix,0xd);
  groebnerRow10_000_f(groebnerMatrix,0xd);
  groebnerRow11_000_f(groebnerMatrix,0xd);
  groebnerRow12_000_f(groebnerMatrix,0xd);
  sPolynomial14(groebnerMatrix);
  groebnerRow11_000_f(groebnerMatrix,0xe);
  groebnerRow12_000_f(groebnerMatrix,0xe);
  groebnerRow13_000_f(groebnerMatrix,0xe);
  return;
}

Assistant:

void
opengv::absolute_pose::modules::gpnp3::compute(
    Eigen::Matrix<double,15,18> & groebnerMatrix )
{
  sPolynomial4(groebnerMatrix);

  sPolynomial5(groebnerMatrix);
  groebnerRow4_000_f(groebnerMatrix,5);

  sPolynomial6(groebnerMatrix);
  groebnerRow4_000_f(groebnerMatrix,6);
  groebnerRow5_000_f(groebnerMatrix,6);

  sPolynomial7(groebnerMatrix);
  groebnerRow5_100_f(groebnerMatrix,7);
  groebnerRow6_100_f(groebnerMatrix,7);
  groebnerRow4_000_f(groebnerMatrix,7);
  groebnerRow5_000_f(groebnerMatrix,7);
  groebnerRow6_000_f(groebnerMatrix,7);

  sPolynomial8(groebnerMatrix);
  groebnerRow4_100_f(groebnerMatrix,8);
  groebnerRow5_100_f(groebnerMatrix,8);
  groebnerRow6_100_f(groebnerMatrix,8);
  groebnerRow7_000_f(groebnerMatrix,8);
  groebnerRow3_000_f(groebnerMatrix,8);
  groebnerRow4_000_f(groebnerMatrix,8);
  groebnerRow5_000_f(groebnerMatrix,8);
  groebnerRow6_000_f(groebnerMatrix,8);

  sPolynomial9(groebnerMatrix);
  groebnerRow5_010_f(groebnerMatrix,9);
  groebnerRow3_100_f(groebnerMatrix,9);
  groebnerRow4_100_f(groebnerMatrix,9);
  groebnerRow5_100_f(groebnerMatrix,9);
  groebnerRow6_100_f(groebnerMatrix,9);
  groebnerRow7_000_f(groebnerMatrix,9);
  groebnerRow8_000_f(groebnerMatrix,9);
  groebnerRow3_000_f(groebnerMatrix,9);
  groebnerRow4_000_f(groebnerMatrix,9);
  groebnerRow5_000_f(groebnerMatrix,9);
  groebnerRow6_000_f(groebnerMatrix,9);

  sPolynomial10(groebnerMatrix);
  groebnerRow4_010_f(groebnerMatrix,10);
  groebnerRow5_010_f(groebnerMatrix,10);
  groebnerRow3_100_f(groebnerMatrix,10);
  groebnerRow4_100_f(groebnerMatrix,10);
  groebnerRow5_100_f(groebnerMatrix,10);
  groebnerRow6_100_f(groebnerMatrix,10);
  groebnerRow9_100_f(groebnerMatrix,10);
  groebnerRow8_000_f(groebnerMatrix,10);
  groebnerRow3_000_f(groebnerMatrix,10);
  groebnerRow4_000_f(groebnerMatrix,10);
  groebnerRow5_000_f(groebnerMatrix,10);
  groebnerRow6_000_f(groebnerMatrix,10);
  groebnerRow9_000_f(groebnerMatrix,10);

  sPolynomial11(groebnerMatrix);
  groebnerRow6_000_f(groebnerMatrix,11);
  groebnerRow9_000_f(groebnerMatrix,11);
  groebnerRow10_000_f(groebnerMatrix,11);

  sPolynomial12(groebnerMatrix);
  groebnerRow10_100_f(groebnerMatrix,12);
  groebnerRow11_100_f(groebnerMatrix,12);
  groebnerRow9_000_f(groebnerMatrix,12);
  groebnerRow10_000_f(groebnerMatrix,12);
  groebnerRow11_000_f(groebnerMatrix,12);

  sPolynomial13(groebnerMatrix);
  groebnerRow10_100_f(groebnerMatrix,13);
  groebnerRow11_010_f(groebnerMatrix,13);
  groebnerRow12_010_f(groebnerMatrix,13);
  groebnerRow11_100_f(groebnerMatrix,13);
  groebnerRow12_100_f(groebnerMatrix,13);
  groebnerRow10_000_f(groebnerMatrix,13);
  groebnerRow11_000_f(groebnerMatrix,13);
  groebnerRow12_000_f(groebnerMatrix,13);

  sPolynomial14(groebnerMatrix);
  groebnerRow11_000_f(groebnerMatrix,14);
  groebnerRow12_000_f(groebnerMatrix,14);
  groebnerRow13_000_f(groebnerMatrix,14);

}